

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpserver.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  ulong uVar3;
  int *piVar4;
  ssize_t sVar5;
  size_t sVar6;
  char **in_RSI;
  int in_EDI;
  fd_set *__arr;
  uint __i;
  timespec f;
  int elements_1;
  int elements;
  char txmsg [12003];
  char rxmsg [12004];
  uchar msg [6001];
  int idx;
  int verbose;
  int local_port;
  int nbytes;
  int i;
  fd_set readfds;
  sigset_t sigset;
  sigaction signalaction;
  socklen_t caddrlen;
  socklen_t sin_size;
  sockaddr_can caddr;
  sockaddr_in clientaddr;
  sockaddr_in saddr;
  int sc;
  int sa;
  int sl;
  int opt;
  undefined4 in_stack_ffffffffffff8830;
  int in_stack_ffffffffffff8834;
  char *in_stack_ffffffffffff8838;
  int local_77b4;
  uint local_779c;
  timespec local_7788;
  sockaddr *local_7778;
  int local_7770;
  int local_776c;
  char local_7768 [12016];
  char local_4878;
  char acStack_4877 [12015];
  byte local_1988 [6012];
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  fd_set local_1f8;
  sigset_t local_178;
  sigaction local_f8;
  socklen_t local_60;
  socklen_t local_5c;
  sockaddr local_58;
  sockaddr local_40;
  sockaddr local_30;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_5c = 0x10;
  local_60 = 0x18;
  local_204 = 0;
  local_208 = 0;
  local_20c = 0;
  local_58.sa_data[6] = -1;
  local_58.sa_data[7] = -1;
  local_58.sa_data[8] = -1;
  local_58.sa_data[9] = -1;
  local_58.sa_data[10] = -1;
  local_58.sa_data[0xb] = -1;
  local_58.sa_data[0xc] = -1;
  local_58.sa_data[0xd] = -1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_14 = getopt(local_8,local_10,"l:s:d:x:p:P:b:m:w:t:L:v?"), local_14 != 0xffffffff) {
    switch(local_14) {
    case 0x3f:
      __xpg_basename(*local_10);
      print_usage((char *)0x101b29);
      exit(0);
    default:
      fprintf(_stderr,"Unknown option %c\n",(ulong)local_14);
      __xpg_basename(*local_10);
      print_usage((char *)0x101b67);
      exit(1);
    case 0x4c:
      iVar1 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x105134,0x105135);
      if (iVar1 != 3) {
        printf("unknown link layer options \'%s\'.\n",_optarg);
        __xpg_basename(*local_10);
        print_usage((char *)0x101afb);
        exit(0);
      }
      break;
    case 0x50:
      if (*_optarg == 'l') {
        main::opts.flags = main::opts.flags | 0x10;
      }
      else if (*_optarg == 'c') {
        main::opts.flags = main::opts.flags | 0x20;
      }
      else {
        if (*_optarg != 'a') {
          printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)*_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x1019eb);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 0x30;
      }
      break;
    case 0x62:
      uVar3 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.bs = (__u8)uVar3;
      break;
    case 100:
      uVar3 = strtoul(_optarg,(char **)0x0,0x10);
      local_58.sa_data._6_4_ = SUB84(uVar3,0);
      sVar6 = strlen(_optarg);
      if (7 < sVar6) {
        local_58.sa_data._6_4_ = local_58.sa_data._6_4_ | 0x80000000;
      }
      break;
    case 0x6c:
      uVar3 = strtoul(_optarg,(char **)0x0,10);
      local_204 = (int)uVar3;
      break;
    case 0x6d:
      uVar3 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.stmin = (__u8)uVar3;
      break;
    case 0x70:
      local_7770 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x10512d,0x10512e);
      if (local_7770 == 1) {
        main::opts.flags = main::opts.flags | 4;
      }
      else if (local_7770 == 2) {
        main::opts.flags = main::opts.flags | 0xc;
      }
      else {
        iVar1 = __isoc99_sscanf(_optarg,":%hhx",0x10512e);
        if (iVar1 != 1) {
          printf("incorrect padding values \'%s\'.\n",_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x10193c);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 8;
      }
      break;
    case 0x73:
      uVar3 = strtoul(_optarg,(char **)0x0,0x10);
      local_58.sa_data._10_4_ = SUB84(uVar3,0);
      sVar6 = strlen(_optarg);
      if (7 < sVar6) {
        local_58.sa_data._10_4_ = local_58.sa_data._10_4_ | 0x80000000;
      }
      break;
    case 0x74:
      uVar3 = strtoul(_optarg,(char **)0x0,10);
      main::opts.frame_txtime = (__u32)uVar3;
      break;
    case 0x76:
      local_208 = 1;
      break;
    case 0x77:
      uVar3 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.wftmax = (__u8)uVar3;
      break;
    case 0x78:
      local_776c = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x10512c,0x10512f);
      if (local_776c == 1) {
        main::opts.flags = main::opts.flags | 2;
      }
      else {
        if (local_776c != 2) {
          printf("incorrect extended addr values \'%s\'.\n",_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x101864);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 0x202;
      }
    }
  }
  if ((((local_8 - _optind != 1) || (local_204 == 0)) || (local_58.sa_data._10_4_ == 0xffffffff)) ||
     (local_58.sa_data._6_4_ == 0xffffffff)) {
    __xpg_basename(*local_10);
    print_usage((char *)0x101bc1);
    exit(1);
  }
  sigemptyset(&local_178);
  local_f8.__sigaction_handler.sa_handler = childdied;
  memcpy(&local_f8.sa_mask,&local_178,0x80);
  local_f8.sa_flags = 0;
  sigaction(0x11,&local_f8,(sigaction *)0x0);
  local_18 = socket(2,1,0);
  if (local_18 < 0) {
    perror("inetsocket");
    exit(1);
  }
  local_30.sa_family = 2;
  local_30.sa_data._2_4_ = htonl(0);
  local_30.sa_data._0_2_ = htons((uint16_t)local_204);
  while( true ) {
    local_7778 = &local_30;
    iVar1 = bind(local_18,local_7778,0x10);
    if (-1 < iVar1) break;
    local_7788.tv_sec = 0;
    local_7788.tv_nsec = 100000000;
    printf(".");
    fflush((FILE *)0x0);
    nanosleep(&local_7788,(timespec *)0x0);
  }
  iVar1 = listen(local_18,3);
  if (iVar1 != 0) {
    perror("listen");
    exit(1);
  }
  while( true ) {
    while (local_1c = accept(local_18,&local_40,&local_5c), local_1c < 1) {
      piVar4 = __errno_location();
      if (*piVar4 != 4) {
        perror("accept");
        exit(1);
      }
    }
    _Var2 = fork();
    if (_Var2 == 0) break;
    close(local_1c);
  }
  local_20 = socket(0x1d,2,6);
  if (-1 < local_20) {
    setsockopt(local_20,0x6a,1,&main::opts,0xc);
    setsockopt(local_20,0x6a,2,&main::fcopts,3);
    if ((main::llopts.tx_dl != '\0') &&
       (iVar1 = setsockopt(local_20,0x6a,5,&main::llopts,3), iVar1 < 0)) {
      perror("link layer sockopt");
      exit(1);
    }
    local_58.sa_family = 0x1d;
    local_58.sa_data._2_4_ = if_nametoindex(local_10[_optind]);
    if (local_58.sa_data._2_4_ == 0) {
      perror("if_nametoindex");
      exit(1);
    }
    iVar1 = bind(local_20,&local_58,local_60);
    if (iVar1 < 0) {
      perror("bind");
      exit(1);
    }
    do {
      for (local_779c = 0; local_779c < 0x10; local_779c = local_779c + 1) {
        local_1f8.fds_bits[local_779c] = 0;
      }
      local_1f8.fds_bits[local_20 / 0x40] =
           1L << ((byte)((long)local_20 % 0x40) & 0x3f) | local_1f8.fds_bits[local_20 / 0x40];
      local_1f8.fds_bits[local_1c / 0x40] =
           1L << ((byte)((long)local_1c % 0x40) & 0x3f) | local_1f8.fds_bits[local_1c / 0x40];
      local_77b4 = local_1c;
      if (local_1c < local_20) {
        local_77b4 = local_20;
      }
      local_77b4 = local_77b4 + 1;
      select(local_77b4,&local_1f8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if ((local_1f8.fds_bits[local_20 / 0x40] & 1L << ((byte)((long)local_20 % 0x40) & 0x3f)) != 0)
      {
        sVar5 = read(local_20,local_1988,0x1771);
        local_200 = (int)sVar5;
        if ((local_200 < 1) || (6000 < local_200)) {
          perror("read from isotp socket");
          exit(1);
        }
        local_4878 = '<';
        for (local_1fc = 0; local_1fc < local_200; local_1fc = local_1fc + 1) {
          sprintf(acStack_4877 + (local_1fc << 1),"%02X",(ulong)local_1988[local_1fc]);
        }
        strcat(&local_4878,">\n");
        if (local_208 != 0) {
          printf("CAN>TCP %s",&local_4878);
        }
        in_stack_ffffffffffff8838 = &local_4878;
        in_stack_ffffffffffff8834 = local_1c;
        sVar6 = strlen(&local_4878);
        send(in_stack_ffffffffffff8834,in_stack_ffffffffffff8838,sVar6,0);
      }
      uVar3 = local_1f8.fds_bits[local_1c / 0x40];
      if ((uVar3 & 1L << ((byte)((long)local_1c % 0x40) & 0x3f)) != 0) {
        sVar5 = read(local_1c,local_7768 + local_20c,1);
        iVar1 = (int)(uVar3 >> 0x20);
        if (sVar5 < 1) {
          perror("read from tcp/ip socket");
          exit(1);
        }
        if (local_20c == 0) {
          if (local_7768[0] == '<') {
            local_20c = 1;
          }
        }
        else if (local_20c < 0x2ee2) {
          if (local_7768[local_20c] == '>') {
            local_7768[local_20c + 1] = '\0';
            local_20c = 0;
            sVar6 = strlen(local_7768);
            if ((3 < sVar6) && (sVar6 = strlen(local_7768), (sVar6 & 1) == 0)) {
              if (local_208 != 0) {
                printf("TCP>CAN %s\n",local_7768);
              }
              sVar6 = strlen(local_7768);
              local_200 = (int)(sVar6 - 2 >> 1);
              iVar1 = b64hex(in_stack_ffffffffffff8838,
                             (uchar *)CONCAT44(in_stack_ffffffffffff8834,in_stack_ffffffffffff8830),
                             iVar1);
              if (iVar1 == 0) {
                send(local_20,local_1988,(long)local_200,0);
              }
            }
          }
          else {
            local_20c = local_20c + 1;
          }
        }
        else {
          local_20c = 0;
        }
      }
    } while( true );
  }
  perror("socket");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	extern int optind, opterr, optopt;
	int opt;

	int sl, sa, sc; /* (L)isten, (A)ccept, (C)AN sockets */ 
	struct sockaddr_in  saddr, clientaddr;
	struct sockaddr_can caddr;
	static struct can_isotp_options opts;
	static struct can_isotp_fc_options fcopts;
	static struct can_isotp_ll_options llopts;
	socklen_t sin_size = sizeof(clientaddr);
	socklen_t caddrlen = sizeof(caddr);

	struct sigaction signalaction;
	sigset_t sigset;

	fd_set readfds;

	int i;
	int nbytes;

	int local_port = 0;
	int verbose = 0;

	int idx = 0; /* index in txmsg[] */

	unsigned char msg[MAX_PDU_LENGTH + 1];   /* isotp socket message buffer (4095 + test_for_too_long_byte)*/
	char rxmsg[MAX_PDU_LENGTH * 2 + 4]; /* isotp->tcp ASCII message buffer (4095*2 + < > \n null) */
	char txmsg[MAX_PDU_LENGTH * 2 + 3]; /* tcp->isotp ASCII message buffer (4095*2 + < > null) */

	/* mark missing mandatory commandline options as missing */
	caddr.can_addr.tp.tx_id = caddr.can_addr.tp.rx_id = NO_CAN_ID;

	while ((opt = getopt(argc, argv, "l:s:d:x:p:P:b:m:w:t:L:v?")) != -1) {
		switch (opt) {
		case 'l':
			local_port = strtoul(optarg, NULL, 10);
			break;

		case 's':
			caddr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				caddr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
			break;

		case 'd':
			caddr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				caddr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
			break;

		case 'x':
		{
			int elements = sscanf(optarg, "%hhx:%hhx",
					      &opts.ext_address,
					      &opts.rx_ext_address);

			if (elements == 1)
				opts.flags |= CAN_ISOTP_EXTEND_ADDR;
			else if (elements == 2)
				opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
			else {
				printf("incorrect extended addr values '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;
		}

		case 'p':
		{
			int elements = sscanf(optarg, "%hhx:%hhx",
					      &opts.txpad_content,
					      &opts.rxpad_content);

			if (elements == 1)
				opts.flags |= CAN_ISOTP_TX_PADDING;
			else if (elements == 2)
				opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
			else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
				opts.flags |= CAN_ISOTP_RX_PADDING;
			else {
				printf("incorrect padding values '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;
		}

		case 'P':
			if (optarg[0] == 'l')
				opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
			else if (optarg[0] == 'c')
				opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
			else if (optarg[0] == 'a')
				opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
			else {
				printf("unknown padding check option '%c'.\n", optarg[0]);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;

		case 'b':
			fcopts.bs = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'm':
			fcopts.stmin = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'w':
			fcopts.wftmax = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 't':
			opts.frame_txtime = strtoul(optarg, NULL, 10);
			break;

		case 'L':
			if (sscanf(optarg, "%hhu:%hhu:%hhu",
				   &llopts.mtu,
				   &llopts.tx_dl,
				   &llopts.tx_flags) != 3) {
				printf("unknown link layer options '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 1) || (local_port == 0) ||
	    (caddr.can_addr.tp.tx_id == NO_CAN_ID) ||
	    (caddr.can_addr.tp.rx_id == NO_CAN_ID)) {
		print_usage(basename(argv[0]));
		exit(1);
	}
  
	sigemptyset(&sigset);
	signalaction.sa_handler = &childdied;
	signalaction.sa_mask = sigset;
	signalaction.sa_flags = 0;
	sigaction(SIGCHLD, &signalaction, NULL);  /* signal for dying child */

	if((sl = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
		perror("inetsocket");
		exit(1);
	}

	saddr.sin_family = AF_INET;
	saddr.sin_addr.s_addr = htonl(INADDR_ANY);
	saddr.sin_port = htons(local_port);

	while(bind(sl,(struct sockaddr*)&saddr, sizeof(saddr)) < 0) {
		struct timespec f = {
			.tv_nsec = 100 * 1000 * 1000,
		};

		printf(".");
		fflush(NULL);
		nanosleep(&f, NULL);
	}

	if (listen(sl, 3) != 0) {
		perror("listen");
		exit(1);
	}

	while (1) { 
		sa = accept(sl,(struct sockaddr *)&clientaddr, &sin_size);
		if (sa > 0 ){
			if (!fork())
				break;
			close(sa);
		}
		else {
			if (errno != EINTR) {
				/*
				 * If the cause for the error was NOT the
				 * signal from a dying child => give an error
				 */
				perror("accept");
				exit(1);
			}
		}
	}

	if ((sc = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
		perror("socket");
		exit(1);
	}

	setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts));
	setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_RECV_FC, &fcopts, sizeof(fcopts));

	if (llopts.tx_dl) {
		if (setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
			perror("link layer sockopt");
			exit(1);
		}
	}

	caddr.can_family = AF_CAN;
	caddr.can_ifindex = if_nametoindex(argv[optind]);
	if (!caddr.can_ifindex) {
		perror("if_nametoindex");
		exit(1);
	}

	if (bind(sc, (struct sockaddr *)&caddr, caddrlen) < 0) {
		perror("bind");
		exit(1);
	}

	while (1) {

		FD_ZERO(&readfds);
		FD_SET(sc, &readfds);
		FD_SET(sa, &readfds);

		select((sc > sa)?sc+1:sa+1, &readfds, NULL, NULL, NULL);

		if (FD_ISSET(sc, &readfds)) {


			nbytes = read(sc, &msg, MAX_PDU_LENGTH + 1);

			if (nbytes < 1 || nbytes > MAX_PDU_LENGTH) {
				perror("read from isotp socket");
				exit(1);
			}

			rxmsg[0] = '<';

			for ( i = 0; i < nbytes; i++)
				sprintf(rxmsg + 1 + 2*i, "%02X", msg[i]);

			/* finalize string for sending */
			strcat(rxmsg, ">\n");

			if (verbose)
				printf("CAN>TCP %s", rxmsg);

			send(sa, rxmsg, strlen(rxmsg), 0);
		}


		if (FD_ISSET(sa, &readfds)) {

			if (read(sa, txmsg+idx, 1) < 1) {
				perror("read from tcp/ip socket");
				exit(1);
			}

			if (!idx) {
				if (txmsg[0] == '<')
					idx = 1;

				continue;
			}

			/* max len is 4095*2 + '<' + '>' = 8192. The buffer index starts with 0 */
			if (idx > MAX_PDU_LENGTH * 2 + 1) {
				idx = 0;
				continue;
			}

			if (txmsg[idx] != '>') {
				idx++;
				continue;
			}

			txmsg[idx+1] = 0;
			idx = 0;

			/* must be an even number of bytes and at least one data byte <XX> */
			if (strlen(txmsg) < 4 || strlen(txmsg) % 2)
				continue;

			if (verbose)
				printf("TCP>CAN %s\n", txmsg);

			nbytes = (strlen(txmsg)-2)/2;
			if (b64hex(txmsg+1, msg, nbytes) == 0)
				send(sc, msg, nbytes, 0);
		}
	}

	close(sc);
	close(sa);

	return 0;
}